

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Bool,_(ritobin::Category)1>::from_json
          (ErrorStackOption *__return_storage_ptr__,Bool *value,json *json)

{
  bool bVar1;
  undefined1 local_50 [48];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_20;
  json *json_local;
  Bool *value_local;
  
  local_20 = json;
  json_local = (json *)value;
  value_local = (Bool *)__return_storage_ptr__;
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_boolean(json);
  if (bVar1) {
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_bool<bool,_0>(local_20);
    json_local->m_type = bVar1;
    std::optional<ritobin::io::json_impl::ErrorStack>::optional(__return_storage_ptr__);
  }
  else {
    local_50._0_8_ = "bool";
    local_50._8_8_ = "json.is_boolean()";
    std::__cxx11::string::string((string *)(local_50 + 0x10));
    std::optional<ritobin::io::json_impl::ErrorStack>::
    optional<ritobin::io::json_impl::ErrorStack,_true>
              (__return_storage_ptr__,(ErrorStack *)local_50);
    ErrorStack::~ErrorStack((ErrorStack *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            using value_t = std::remove_cvref_t<decltype(value.value)>;
            if constexpr (std::is_same_v<value_t, bool>) {
                bin_json_assert(json.is_boolean());
            } else {
                bin_json_assert(json.is_number());
            }
            value.value = json;
            return std::nullopt;
        }